

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlParserCtxtPtr htmlCreateMemoryParserCtxt(char *buffer,int size)

{
  xmlParserInputBufferPtr pxVar1;
  xmlParserInputPtr input_00;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  int size_local;
  char *buffer_local;
  
  if (buffer == (char *)0x0) {
    buffer_local = (char *)0x0;
  }
  else if (size < 1) {
    buffer_local = (char *)0x0;
  }
  else {
    buffer_local = (char *)htmlNewParserCtxt();
    if ((htmlParserCtxtPtr)buffer_local == (htmlParserCtxtPtr)0x0) {
      buffer_local = (char *)0x0;
    }
    else {
      pxVar1 = xmlParserInputBufferCreateMem(buffer,size,XML_CHAR_ENCODING_NONE);
      if (pxVar1 == (xmlParserInputBufferPtr)0x0) {
        buffer_local = (char *)0x0;
      }
      else {
        input_00 = xmlNewInputStream((xmlParserCtxtPtr)buffer_local);
        if (input_00 == (xmlParserInputPtr)0x0) {
          xmlFreeParserCtxt((xmlParserCtxtPtr)buffer_local);
          buffer_local = (char *)0x0;
        }
        else {
          input_00->filename = (char *)0x0;
          input_00->buf = pxVar1;
          xmlBufResetInput(pxVar1->buffer,input_00);
          inputPush((xmlParserCtxtPtr)buffer_local,input_00);
        }
      }
    }
  }
  return (htmlParserCtxtPtr)buffer_local;
}

Assistant:

htmlParserCtxtPtr
htmlCreateMemoryParserCtxt(const char *buffer, int size) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlParserInputBufferPtr buf;

    if (buffer == NULL)
	return(NULL);
    if (size <= 0)
	return(NULL);

    ctxt = htmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    buf = xmlParserInputBufferCreateMem(buffer, size, XML_CHAR_ENCODING_NONE);
    if (buf == NULL) return(NULL);

    input = xmlNewInputStream(ctxt);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    input->filename = NULL;
    input->buf = buf;
    xmlBufResetInput(buf->buffer, input);

    inputPush(ctxt, input);
    return(ctxt);
}